

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeLoopReturn
          (SimplifyLocals<true,_true,_true> *this,Loop *loop)

{
  Block *this_00;
  Module *pMVar1;
  LocalSet *expression;
  Expression **ppEVar2;
  mapped_type *pmVar3;
  Nop *pNVar4;
  ulong index;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Loop *local_60;
  Loop *loop_local;
  Expression *local_50;
  Sinkables *local_48;
  LocalSet *local_40;
  _Rb_tree_color local_34 [2];
  Index goodIndex;
  
  if (((loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id == 0) &&
     ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_34[0] = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color
    ;
    this_00 = (Block *)loop->body;
    local_60 = loop;
    if (((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
         BlockId) &&
       (((this_00->name).super_IString.str._M_str == (char *)0x0 &&
        ((this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
         usedElements != 0)))) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&(this_00->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      if ((*ppEVar2)->_id == NopId) {
        local_48 = &this->sinkables;
        pMVar1 = (this->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .
                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .
                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .currModule;
        pmVar3 = std::
                 map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                 ::at(local_48,local_34);
        loop_local = (Loop *)pmVar3->item;
        local_40 = Expression::cast<wasm::LocalSet>
                             (*(Expression **)
                               &(loop_local->super_SpecificExpression<(wasm::Expression::Id)3>).
                                super_Expression);
        local_50 = local_40->value;
        index = (this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements - 1;
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(this_00->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        *ppEVar2 = local_50;
        pNVar4 = MixedArena::alloc<wasm::Nop>(&pMVar1->allocator);
        *(Nop **)&(loop_local->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression =
             pNVar4;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
        Block::finalize(this_00,type_,Unknown);
        if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id !=
            0) {
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
          Loop::finalize(loop,type__00);
          expression = local_40;
          local_40->value = (Expression *)loop;
          LocalSet::finalize(local_40);
          Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
          ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                           ,(Expression *)expression);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
          ::clear(&local_48->_M_t);
          this->anotherCycle = true;
          return;
        }
        __assert_fail("block->type != Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x1ee,
                      "void wasm::SimplifyLocals<>::optimizeLoopReturn(Loop *) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
    }
    std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::push_back
              (&this->loopsToEnlarge,&local_60);
  }
  return;
}

Assistant:

void optimizeLoopReturn(Loop* loop) {
    // If there is a sinkable thing in an eligible loop, we can optimize
    // it in a trivial way to the outside of the loop.
    if (loop->type != Type::none) {
      return;
    }
    if (sinkables.empty()) {
      return;
    }
    Index goodIndex = sinkables.begin()->first;
    // Ensure we have a place to write the return values for, if not, we
    // need another cycle.
    auto* block = loop->body->dynCast<Block>();
    if (!block || block->name.is() || block->list.size() == 0 ||
        !block->list.back()->is<Nop>()) {
      loopsToEnlarge.push_back(loop);
      return;
    }
    Builder builder(*this->getModule());
    auto** item = sinkables.at(goodIndex).item;
    auto* set = (*item)->template cast<LocalSet>();
    block->list[block->list.size() - 1] = set->value;
    *item = builder.makeNop();
    block->finalize();
    assert(block->type != Type::none);
    loop->finalize();
    set->value = loop;
    set->finalize();
    this->replaceCurrent(set);
    // We moved things around, clear all tracking; we'll do another cycle
    // anyhow.
    sinkables.clear();
    anotherCycle = true;
  }